

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_debugInfo_beginLineInformation(sysbvm_dwarf_debugInfo_builder_t *builder)

{
  size_t sVar1;
  sysbvm_dwarf_debugInfo_builder_t *builder_local;
  
  sysbvm_dwarf_encodeDWord(&builder->line,0);
  sysbvm_dwarf_encodeWord(&builder->line,(uint16_t)builder->version);
  sVar1 = sysbvm_dwarf_encodeDWord(&builder->line,0);
  builder->lineHeaderLengthOffset = (uint32_t)sVar1;
  sysbvm_dwarf_encodeByte
            (&builder->line,(uint8_t)(builder->lineProgramHeader).minimumInstructionLength);
  sysbvm_dwarf_encodeByte
            (&builder->line,(uint8_t)(builder->lineProgramHeader).maximumOperationsPerInstruction);
  sysbvm_dwarf_encodeByte(&builder->line,(builder->lineProgramHeader).defaultIsStatement & 1);
  sysbvm_dwarf_encodeByte(&builder->line,(builder->lineProgramHeader).lineBase);
  sysbvm_dwarf_encodeByte(&builder->line,(builder->lineProgramHeader).lineRange);
  sysbvm_dwarf_encodeByte(&builder->line,(builder->lineProgramHeader).opcodeBase);
  sysbvm_dwarf_encodeByte(&builder->line,'\0');
  sysbvm_dwarf_encodeByte(&builder->line,'\x01');
  sysbvm_dwarf_encodeByte(&builder->line,'\x01');
  sysbvm_dwarf_encodeByte(&builder->line,'\x01');
  sysbvm_dwarf_encodeByte(&builder->line,'\x01');
  sysbvm_dwarf_encodeByte(&builder->line,'\0');
  sysbvm_dwarf_encodeByte(&builder->line,'\0');
  sysbvm_dwarf_encodeByte(&builder->line,'\0');
  sysbvm_dwarf_encodeByte(&builder->line,'\x01');
  sysbvm_dwarf_encodeByte(&builder->line,'\0');
  sysbvm_dwarf_encodeByte(&builder->line,'\0');
  sysbvm_dwarf_encodeByte(&builder->line,'\x01');
  (builder->lineProgramState).regAddress = 0;
  (builder->lineProgramState).regOpIndex = 0;
  (builder->lineProgramState).regFile = 1;
  (builder->lineProgramState).regLine = 1;
  (builder->lineProgramState).regColumn = 0;
  (builder->lineProgramState).regIsStatement =
       (_Bool)((builder->lineProgramHeader).defaultIsStatement & 1);
  (builder->lineProgramState).regBasicBlock = false;
  (builder->lineProgramState).regEndSequence = false;
  (builder->lineProgramState).regPrologueEnd = false;
  (builder->lineProgramState).regEpilogueBegin = false;
  (builder->lineProgramState).regISA = 0;
  (builder->lineProgramState).regDiscriminator = false;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_beginLineInformation(sysbvm_dwarf_debugInfo_builder_t *builder)
{
    sysbvm_dwarf_encodeDWord(&builder->line, 0);
    sysbvm_dwarf_encodeWord(&builder->line, builder->version);
    builder->lineHeaderLengthOffset = (uint32_t)sysbvm_dwarf_encodeDWord(&builder->line, 0); // Header length
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.minimumInstructionLength);
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.maximumOperationsPerInstruction);
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.defaultIsStatement);
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.lineBase);
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.lineRange);
    sysbvm_dwarf_encodeByte(&builder->line, builder->lineProgramHeader.opcodeBase);

    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_copy
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_advance_pc
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_advance_line
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_set_file
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_set_column
    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_negate_stmt
    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_set_basic_block
    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_const_add_pc
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_fixed_advance_pc
    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_set_prologue_end
    sysbvm_dwarf_encodeByte(&builder->line, 0); // DW_LNS_set_epilogue_begin
    sysbvm_dwarf_encodeByte(&builder->line, 1); // DW_LNS_set_isa

    builder->lineProgramState.regAddress = 0;
    builder->lineProgramState.regOpIndex = 0;
    builder->lineProgramState.regFile = 1;
    builder->lineProgramState.regLine = 1;
    builder->lineProgramState.regColumn = 0;
    builder->lineProgramState.regIsStatement = builder->lineProgramHeader.defaultIsStatement;
    builder->lineProgramState.regBasicBlock = false;
    builder->lineProgramState.regEndSequence = false;
    builder->lineProgramState.regPrologueEnd = false;
    builder->lineProgramState.regEpilogueBegin = false;
    builder->lineProgramState.regISA = 0;
    builder->lineProgramState.regDiscriminator = false;
}